

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase33::run(TestCase33 *this)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  char *pcVar3;
  size_t sVar4;
  Builder *params;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params_00;
  Builder *extraout_RDX_01;
  Builder *extraout_RDX_02;
  Builder *pBVar5;
  Builder local_198;
  char *local_180;
  DebugComparison<const_char_(&)[244],_kj::String> _kjCondition;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_198,&builder.super_MessageBuilder);
  _kjCondition.right.content.size_ = (size_t)local_198.builder.pointer;
  _kjCondition.left = (char (*) [244])local_198.builder.segment;
  _kjCondition.right.content.ptr = (char *)local_198.builder.capTable;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x140006);
  local_180 = 
  "(voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64Field = 0, uInt8Field = 0, uInt16Field = 0, uInt32Field = 0, uInt64Field = 0, float32Field = 0, float64Field = 0, enumField = foo, interfaceField = void)"
  ;
  kj::str<capnproto_test::capnp::test::TestAllTypes::Builder&>
            ((String *)&local_198,(kj *)&root,params);
  kj::_::DebugExpression<char_const(&)[244]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[244]> *)&local_180,(String *)&local_198);
  pCVar2 = local_198.builder.capTable;
  pSVar1 = local_198.builder.segment;
  pBVar5 = extraout_RDX;
  if (local_198.builder.segment != (SegmentBuilder *)0x0) {
    local_198.builder.segment = (SegmentBuilder *)0x0;
    local_198.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_198.builder.pointer)(local_198.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    pBVar5 = extraout_RDX_00;
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestAllTypes::Builder&>
              ((String *)&local_198,(kj *)&root,pBVar5);
    kj::_::Debug::
    log<char_const(&)[326],kj::_::DebugComparison<char_const(&)[244],kj::String>&,char_const(&)[244],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x37,ERROR,
               "\"failed: expected \" \"(\\\"(\\\" \\\"voidField = void, \\\" \\\"boolField = false, \\\" \\\"int8Field = 0, \\\" \\\"int16Field = 0, \\\" \\\"int32Field = 0, \\\" \\\"int64Field = 0, \\\" \\\"uInt8Field = 0, \\\" \\\"uInt16Field = 0, \\\" \\\"uInt32Field = 0, \\\" \\\"uInt64Field = 0, \\\" \\\"float32Field = 0, \\\" \\\"float64Field = 0, \\\" \\\"enumField = foo, \\\" \\\"interfaceField = void)\\\") == (kj::str(root))\", _kjCondition, \"(\" \"voidField = void, \" \"boolField = false, \" \"int8Field = 0, \" \"int16Field = 0, \" \"int32Field = 0, \" \"int64Field = 0, \" \"uInt8Field = 0, \" \"uInt16Field = 0, \" \"uInt32Field = 0, \" \"uInt64Field = 0, \" \"float32Field = 0, \" \"float64Field = 0, \" \"enumField = foo, \" \"interfaceField = void)\", kj::str(root)"
               ,(char (*) [326])
                "failed: expected (\"(\" \"voidField = void, \" \"boolField = false, \" \"int8Field = 0, \" \"int16Field = 0, \" \"int32Field = 0, \" \"int64Field = 0, \" \"uInt8Field = 0, \" \"uInt16Field = 0, \" \"uInt32Field = 0, \" \"uInt64Field = 0, \" \"float32Field = 0, \" \"float64Field = 0, \" \"enumField = foo, \" \"interfaceField = void)\") == (kj::str(root))"
               ,&_kjCondition,
               (char (*) [244])
               "(voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64Field = 0, uInt8Field = 0, uInt16Field = 0, uInt32Field = 0, uInt64Field = 0, float32Field = 0, float64Field = 0, enumField = foo, interfaceField = void)"
               ,(String *)&local_198);
    pCVar2 = local_198.builder.capTable;
    pSVar1 = local_198.builder.segment;
    if (local_198.builder.segment != (SegmentBuilder *)0x0) {
      local_198.builder.segment = (SegmentBuilder *)0x0;
      local_198.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_198.builder.pointer)(local_198.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    }
  }
  sVar4 = _kjCondition.right.content.size_;
  pcVar3 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  initTestMessage((Builder)builder.super_MessageBuilder.arenaSpace._56_40_);
  local_180 = 
  "(voidField = void, boolField = true, int8Field = -123, int16Field = -12345, int32Field = -12345678, int64Field = -123456789012345, uInt8Field = 234, uInt16Field = 45678, uInt32Field = 3456789012, uInt64Field = 12345678901234567890, float32Field = 1234.5, float64Field = -1.23e47, textField = \"foo\", dataField = \"bar\", structField = (voidField = void, boolField = true, int8Field = -12, int16Field = 3456, int32Field = -78901234, int64Field = 56789012345678, uInt8Field = 90, uInt16Field = 1234, uInt32Field = 56789012, uInt64Field = 345678901234567890, float32Field = -1.25e-10, float64Field = 345, textField = \"baz\", dataField = \"qux\", structField = (voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64Field = 0, uInt8Field = 0, uInt16Field = 0, uInt32Field = 0, uInt64Field = 0, float32Field = 0, float64Field = 0, textField = \"nested\", structField = (voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64Field = 0, uInt8Field = 0, uInt16Field = 0, uInt32Field = 0, uInt64Field = 0, float32Field = 0, float64Field = 0, textField = \"really nested\", enumField = foo, interfaceField = void), enumField = foo, interfaceField = void), enumField = baz, interfaceField = void, voidList = [void, void, void], boolList = [false, true, false, true, true], int8List = [12, -34, -128, 127], int16List = [1234, -5678, -32768, 32767], int32List = [12345678, -90123456, -2147483648, 2147483647], int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807], uInt8List = [12, 34, 0, 255], uInt16List = [1234, 5678, 0, 65535], uInt32List = [12345678, 90123456, 0, 4294967295], uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615], float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-37], float64List = [0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306], textList = [\"quux\", \"corge\", \"grault\"], dataList = [\"garply\", \"waldo\", \"fred\"], structList = [(voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64..." /* TRUNCATED STRING LITERAL */
  ;
  kj::str<capnproto_test::capnp::test::TestAllTypes::Builder&>
            ((String *)&local_198,(kj *)&root,params_00);
  kj::_::DebugExpression<char_const(&)[4235]>::operator==
            ((DebugComparison<const_char_(&)[4235],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4235]> *)&local_180,(String *)&local_198);
  pCVar2 = local_198.builder.capTable;
  pSVar1 = local_198.builder.segment;
  pBVar5 = extraout_RDX_01;
  if (local_198.builder.segment != (SegmentBuilder *)0x0) {
    local_198.builder.segment = (SegmentBuilder *)0x0;
    local_198.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_198.builder.pointer)(local_198.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    pBVar5 = extraout_RDX_02;
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestAllTypes::Builder&>
              ((String *)&local_198,(kj *)&root,pBVar5);
    kj::_::Debug::
    log<char_const(&)[4905],kj::_::DebugComparison<char_const(&)[4235],kj::String>&,char_const(&)[4235],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0xfe,ERROR,
               "\"failed: expected \" \"(\\\"(\\\" \\\"voidField = void, \\\" \\\"boolField = true, \\\" \\\"int8Field = -123, \\\" \\\"int16Field = -12345, \\\" \\\"int32Field = -12345678, \\\" \\\"int64Field = -123456789012345, \\\" \\\"uInt8Field = 234, \\\" \\\"uInt16Field = 45678, \\\" \\\"uInt32Field = 3456789012, \\\" \\\"uInt64Field = 12345678901234567890, \\\" \\\"float32Field = 1234.5, \\\" \\\"float64Field = -1.23e47, \\\" \\\"textField = \\\\\\\"foo\\\\\\\", \\\" \\\"dataField = \\\\\\\"bar\\\\\\\", \\\" \\\"structField = (\\\" \\\"voidField = void, \\\" \\\"boolField = true, \\\" \\\"int8Field = -12, \\\" \\\"int16Field = 3456, \\\" \\\"int32Field = -78901234, \\\" \\\"int64Field = 56789012345678, \\\" \\\"uInt8Field = 90, \\\" \\\"uInt16Field = 1234, \\\" \\\"uInt32Field = 56789012, \\\" \\\"uInt64Field = 345678901234567890, \\\" \\\"float32Field = -1.25e-10, \\\" \\\"float64Field = 345, \\\" \\\"textField = \\\\\\\"baz\\\\\\\", \\\" \\\"dataField = \\\\\\\"qux\\\\\\\", \\\" \\\"structField = (\\\" \\\"voidField = void, \\\" \\\"boolField = false, \\\" \\\"int8Field = 0, \\\" \\\"int16Field = 0, \\\" \\\"int32Field = 0, \\\" \\\"int64Field = 0, \\\" \\\"uInt8Field = 0, \\\" \\\"uInt16Field = 0, \\\" \\\"uInt32Field = 0, \\\" \\\"uInt64Field = 0, \\\" \\\"float32Field = 0, \\\" \\\"float64Field = 0, \\\" \\\"textField = \\\\\\\"nested\\\\\\\", \\\" \\\"structField = (\\\" \\\"voidField = void, \\\" \\\"boolField = false, \\\" \\\"int8Field = 0, \\\" \\\"int16Field = 0, \\\" \\\"int32Field = 0, \\\" \\\"int64Field = 0, \\\" \\\"uInt8Field = 0, \\\" \\\"uInt16Field = 0, \\\" \\\"uInt32Field = 0, \\\" \\\"uInt64Field = 0, \\\" \\\"float32Field = 0, \\\" \\\"float64Field = 0, \\\" \\\"textField = \\\\\\\"really nested\\\\\\\", \\\" \\\"enumField = foo, \\\" \\\"interfaceField = void), \\\" \\\"enumField = foo, \\\" \\\"interfaceField = void), \\\" \\\"enumField = baz, \\\" \\\"interfaceField = void, \\\" \\\"voidList = [void, void, void], \\\" \\\"boolList = [false, true, false, true, true], \\\" \\\"int8List = [12, -34, -128, 127], \\\" \\\"int16List = [1234, -5678, -32768, 32767], \\\" \\\"int32List = [12345678, -90123456, -2147483648, 2147483647], \\\" \\\"int64List = [123456789012345, -678901234567890, \\\" \\\"-9223372036854775808, 9223372036854775807], \\\" \\\"uInt8List = [12, 34, 0, 255], \\\" \\\"uInt16List = [1234, 5678, 0, 65535], \\\" \\\"uInt32L..." /* TRUNCATED STRING LITERAL */
               ,(char (*) [4905])
                "failed: expected (\"(\" \"voidField = void, \" \"boolField = true, \" \"int8Field = -123, \" \"int16Field = -12345, \" \"int32Field = -12345678, \" \"int64Field = -123456789012345, \" \"uInt8Field = 234, \" \"uInt16Field = 45678, \" \"uInt32Field = 3456789012, \" \"uInt64Field = 12345678901234567890, \" \"float32Field = 1234.5, \" \"float64Field = -1.23e47, \" \"textField = \\\"foo\\\", \" \"dataField = \\\"bar\\\", \" \"structField = (\" \"voidField = void, \" \"boolField = true, \" \"int8Field = -12, \" \"int16Field = 3456, \" \"int32Field = -78901234, \" \"int64Field = 56789012345678, \" \"uInt8Field = 90, \" \"uInt16Field = 1234, \" \"uInt32Field = 56789012, \" \"uInt64Field = 345678901234567890, \" \"float32Field = -1.25e-10, \" \"float64Field = 345, \" \"textField = \\\"baz\\\", \" \"dataField = \\\"qux\\\", \" \"structField = (\" \"voidField = void, \" \"boolField = false, \" \"int8Field = 0, \" \"int16Field = 0, \" \"int32Field = 0, \" \"int64Field = 0, \" \"uInt8Field = 0, \" \"uInt16Field = 0, \" \"uInt32Field = 0, \" \"uInt64Field = 0, \" \"float32Field = 0, \" \"float64Field = 0, \" \"textField = \\\"nested\\\", \" \"structField = (\" \"voidField = void, \" \"boolField = false, \" \"int8Field = 0, \" \"int16Field = 0, \" \"int32Field = 0, \" \"int64Field = 0, \" \"uInt8Field = 0, \" \"uInt16Field = 0, \" \"uInt32Field = 0, \" \"uInt64Field = 0, \" \"float32Field = 0, \" \"float64Field = 0, \" \"textField = \\\"really nested\\\", \" \"enumField = foo, \" \"interfaceField = void), \" \"enumField = foo, \" \"interfaceField = void), \" \"enumField = baz, \" \"interfaceField = void, \" \"voidList = [void, void, void], \" \"boolList = [false, true, false, true, true], \" \"int8List = [12, -34, -128, 127], \" \"int16List = [1234, -5678, -32768, 32767], \" \"int32List = [12345678, -90123456, -2147483648, 2147483647], \" \"int64List = [123456789012345, -678901234567890, \" \"-9223372036854775808, 9223372036854775807], \" \"uInt8List = [12, 34, 0, 255], \" \"uInt16List = [1234, 5678, 0, 65535], \" \"uInt32List = [12345678, 90123456, 0, 4294967295], \" \"uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615], \" \"float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-3..." /* TRUNCATED STRING LITERAL */
               ,(DebugComparison<const_char_(&)[4235],_kj::String> *)&_kjCondition,
               (char (*) [4235])
               "(voidField = void, boolField = true, int8Field = -123, int16Field = -12345, int32Field = -12345678, int64Field = -123456789012345, uInt8Field = 234, uInt16Field = 45678, uInt32Field = 3456789012, uInt64Field = 12345678901234567890, float32Field = 1234.5, float64Field = -1.23e47, textField = \"foo\", dataField = \"bar\", structField = (voidField = void, boolField = true, int8Field = -12, int16Field = 3456, int32Field = -78901234, int64Field = 56789012345678, uInt8Field = 90, uInt16Field = 1234, uInt32Field = 56789012, uInt64Field = 345678901234567890, float32Field = -1.25e-10, float64Field = 345, textField = \"baz\", dataField = \"qux\", structField = (voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64Field = 0, uInt8Field = 0, uInt16Field = 0, uInt32Field = 0, uInt64Field = 0, float32Field = 0, float64Field = 0, textField = \"nested\", structField = (voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64Field = 0, uInt8Field = 0, uInt16Field = 0, uInt32Field = 0, uInt64Field = 0, float32Field = 0, float64Field = 0, textField = \"really nested\", enumField = foo, interfaceField = void), enumField = foo, interfaceField = void), enumField = baz, interfaceField = void, voidList = [void, void, void], boolList = [false, true, false, true, true], int8List = [12, -34, -128, 127], int16List = [1234, -5678, -32768, 32767], int32List = [12345678, -90123456, -2147483648, 2147483647], int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807], uInt8List = [12, 34, 0, 255], uInt16List = [1234, 5678, 0, 65535], uInt32List = [12345678, 90123456, 0, 4294967295], uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615], float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-37], float64List = [0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306], textList = [\"quux\", \"corge\", \"grault\"], dataList = [\"garply\", \"waldo\", \"fred\"], structList = [(voidField = void, boolField = false, int8Field = 0, int16Field = 0, int32Field = 0, int64..." /* TRUNCATED STRING LITERAL */
               ,(String *)&local_198);
    pCVar2 = local_198.builder.capTable;
    pSVar1 = local_198.builder.segment;
    if (local_198.builder.segment != (SegmentBuilder *)0x0) {
      local_198.builder.segment = (SegmentBuilder *)0x0;
      local_198.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_198.builder.pointer)(local_198.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    }
  }
  sVar4 = _kjCondition.right.content.size_;
  pcVar3 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, KjStringification) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  // This test got ugly after printing was changed to always print primitives even when they have
  // default values...

  EXPECT_EQ("("
      "voidField = void, "
      "boolField = false, "
      "int8Field = 0, "
      "int16Field = 0, "
      "int32Field = 0, "
      "int64Field = 0, "
      "uInt8Field = 0, "
      "uInt16Field = 0, "
      "uInt32Field = 0, "
      "uInt64Field = 0, "
      "float32Field = 0, "
      "float64Field = 0, "
      "enumField = foo, "
      "interfaceField = void)",
      kj::str(root));

  initTestMessage(root);

  EXPECT_EQ("("
      "voidField = void, "
      "boolField = true, "
      "int8Field = -123, "
      "int16Field = -12345, "
      "int32Field = -12345678, "
      "int64Field = -123456789012345, "
      "uInt8Field = 234, "
      "uInt16Field = 45678, "
      "uInt32Field = 3456789012, "
      "uInt64Field = 12345678901234567890, "
      "float32Field = 1234.5, "
      "float64Field = -1.23e47, "
      "textField = \"foo\", "
      "dataField = \"bar\", "
      "structField = ("
          "voidField = void, "
          "boolField = true, "
          "int8Field = -12, "
          "int16Field = 3456, "
          "int32Field = -78901234, "
          "int64Field = 56789012345678, "
          "uInt8Field = 90, "
          "uInt16Field = 1234, "
          "uInt32Field = 56789012, "
          "uInt64Field = 345678901234567890, "
          "float32Field = -1.25e-10, "
          "float64Field = 345, "
          "textField = \"baz\", "
          "dataField = \"qux\", "
          "structField = ("
              "voidField = void, "
              "boolField = false, "
              "int8Field = 0, "
              "int16Field = 0, "
              "int32Field = 0, "
              "int64Field = 0, "
              "uInt8Field = 0, "
              "uInt16Field = 0, "
              "uInt32Field = 0, "
              "uInt64Field = 0, "
              "float32Field = 0, "
              "float64Field = 0, "
              "textField = \"nested\", "
              "structField = ("
                "voidField = void, "
                "boolField = false, "
                "int8Field = 0, "
                "int16Field = 0, "
                "int32Field = 0, "
                "int64Field = 0, "
                "uInt8Field = 0, "
                "uInt16Field = 0, "
                "uInt32Field = 0, "
                "uInt64Field = 0, "
                "float32Field = 0, "
                "float64Field = 0, "
                "textField = \"really nested\", "
                "enumField = foo, "
                "interfaceField = void), "
              "enumField = foo, "
              "interfaceField = void), "
          "enumField = baz, "
          "interfaceField = void, "
          "voidList = [void, void, void], "
          "boolList = [false, true, false, true, true], "
          "int8List = [12, -34, -128, 127], "
          "int16List = [1234, -5678, -32768, 32767], "
          "int32List = [12345678, -90123456, -2147483648, 2147483647], "
          "int64List = [123456789012345, -678901234567890, "
                       "-9223372036854775808, 9223372036854775807], "
          "uInt8List = [12, 34, 0, 255], "
          "uInt16List = [1234, 5678, 0, 65535], "
          "uInt32List = [12345678, 90123456, 0, 4294967295], "
          "uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615], "
          "float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-37], "
          "float64List = [0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306], "
          "textList = [\"quux\", \"corge\", \"grault\"], "
          "dataList = [\"garply\", \"waldo\", \"fred\"], "
          "structList = ["
              "("
                "voidField = void, "
                "boolField = false, "
                "int8Field = 0, "
                "int16Field = 0, "
                "int32Field = 0, "
                "int64Field = 0, "
                "uInt8Field = 0, "
                "uInt16Field = 0, "
                "uInt32Field = 0, "
                "uInt64Field = 0, "
                "float32Field = 0, "
                "float64Field = 0, "
                "textField = \"x structlist 1\", "
                "enumField = foo, "
                "interfaceField = void), "
              "("
                "voidField = void, "
                "boolField = false, "
                "int8Field = 0, "
                "int16Field = 0, "
                "int32Field = 0, "
                "int64Field = 0, "
                "uInt8Field = 0, "
                "uInt16Field = 0, "
                "uInt32Field = 0, "
                "uInt64Field = 0, "
                "float32Field = 0, "
                "float64Field = 0, "
                "textField = \"x structlist 2\", "
                "enumField = foo, "
                "interfaceField = void), "
              "("
                "voidField = void, "
                "boolField = false, "
                "int8Field = 0, "
                "int16Field = 0, "
                "int32Field = 0, "
                "int64Field = 0, "
                "uInt8Field = 0, "
                "uInt16Field = 0, "
                "uInt32Field = 0, "
                "uInt64Field = 0, "
                "float32Field = 0, "
                "float64Field = 0, "
                "textField = \"x structlist 3\", "
                "enumField = foo, "
                "interfaceField = void)], "
          "enumList = [qux, bar, grault]), "
      "enumField = corge, "
      "interfaceField = void, "
      "voidList = [void, void, void, void, void, void], "
      "boolList = [true, false, false, true], "
      "int8List = [111, -111], "
      "int16List = [11111, -11111], "
      "int32List = [111111111, -111111111], "
      "int64List = [1111111111111111111, -1111111111111111111], "
      "uInt8List = [111, 222], "
      "uInt16List = [33333, 44444], "
      "uInt32List = [3333333333], "
      "uInt64List = [11111111111111111111], "
      "float32List = [5555.5, inf, -inf, nan], "
      "float64List = [7777.75, inf, -inf, nan], "
      "textList = [\"plugh\", \"xyzzy\", \"thud\"], "
      "dataList = [\"oops\", \"exhausted\", \"rfc3092\"], "
      "structList = ["
          "("
            "voidField = void, "
            "boolField = false, "
            "int8Field = 0, "
            "int16Field = 0, "
            "int32Field = 0, "
            "int64Field = 0, "
            "uInt8Field = 0, "
            "uInt16Field = 0, "
            "uInt32Field = 0, "
            "uInt64Field = 0, "
            "float32Field = 0, "
            "float64Field = 0, "
            "textField = \"structlist 1\", "
            "enumField = foo, "
            "interfaceField = void), "
          "("
            "voidField = void, "
            "boolField = false, "
            "int8Field = 0, "
            "int16Field = 0, "
            "int32Field = 0, "
            "int64Field = 0, "
            "uInt8Field = 0, "
            "uInt16Field = 0, "
            "uInt32Field = 0, "
            "uInt64Field = 0, "
            "float32Field = 0, "
            "float64Field = 0, "
            "textField = \"structlist 2\", "
            "enumField = foo, "
            "interfaceField = void), "
          "("
            "voidField = void, "
            "boolField = false, "
            "int8Field = 0, "
            "int16Field = 0, "
            "int32Field = 0, "
            "int64Field = 0, "
            "uInt8Field = 0, "
            "uInt16Field = 0, "
            "uInt32Field = 0, "
            "uInt64Field = 0, "
            "float32Field = 0, "
            "float64Field = 0, "
            "textField = \"structlist 3\", "
            "enumField = foo, "
            "interfaceField = void)], "
      "enumList = [foo, garply])",
      kj::str(root));
}